

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O2

TestRole __thiscall testing::internal::NoExecDeathTest::AssumeRole(NoExecDeathTest *this)

{
  int iVar1;
  __pid_t _Var2;
  size_t sVar3;
  int *piVar4;
  UnitTestImpl *pUVar5;
  undefined8 extraout_RAX;
  char *pcVar6;
  ostream *poVar7;
  TestRole TVar8;
  string local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  int local_68;
  int local_64;
  int pipe_fd [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  int local_20;
  allocator<char> local_19;
  
  sVar3 = GetThreadCount();
  if (sVar3 != 1) {
    GTestLog::GTestLog((GTestLog *)&local_88,GTEST_WARNING,
                       "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/extern/googletest/googletest/src/gtest-death-test.cc"
                       ,0x464);
    Message::Message((Message *)&local_40);
    std::operator<<((ostream *)(local_40._M_dataplus._M_p + 0x10),
                    "Death tests use fork(), which is unsafe particularly");
    std::operator<<((ostream *)(local_40._M_dataplus._M_p + 0x10),
                    " in a threaded context. For this test, ");
    std::operator<<((ostream *)(local_40._M_dataplus._M_p + 0x10),"Google Test");
    std::operator<<((ostream *)(local_40._M_dataplus._M_p + 0x10)," ");
    poVar7 = (ostream *)(local_40._M_dataplus._M_p + 0x10);
    if (sVar3 == 0) {
      pcVar6 = "couldn\'t detect the number of threads.";
    }
    else {
      std::operator<<(poVar7,"detected ");
      std::ostream::_M_insert<unsigned_long>((ulong)(local_40._M_dataplus._M_p + 0x10));
      poVar7 = (ostream *)(local_40._M_dataplus._M_p + 0x10);
      pcVar6 = " threads.";
    }
    std::operator<<(poVar7,pcVar6);
    std::operator<<((ostream *)(local_40._M_dataplus._M_p + 0x10),
                    " See https://github.com/google/googletest/blob/master/docs/advanced.md#death-tests-and-threads"
                   );
    std::operator<<((ostream *)(local_40._M_dataplus._M_p + 0x10),
                    " for more explanation and suggested solutions, especially if");
    std::operator<<((ostream *)(local_40._M_dataplus._M_p + 0x10),
                    " this is the last message you see before your test times out.");
    StringStreamToString((string *)pipe_fd,(stringstream *)local_40._M_dataplus._M_p);
    if ((stringstream *)local_40._M_dataplus._M_p != (stringstream *)0x0) {
      (**(code **)(*(long *)local_40._M_dataplus._M_p + 8))();
    }
    std::operator<<((ostream *)&std::cerr,(string *)pipe_fd);
    std::__cxx11::string::~string((string *)pipe_fd);
    GTestLog::~GTestLog((GTestLog *)&local_88);
  }
  iVar1 = pipe(&local_68);
  if (iVar1 == -1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"CHECK failed: File ",(allocator<char> *)&local_20);
    std::operator+(&local_e8,&local_c8,
                   "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/extern/googletest/googletest/src/gtest-death-test.cc"
                  );
    std::operator+(&local_108,&local_e8,", line ");
    local_128._M_dataplus._M_p._0_4_ = 0x468;
    StreamableToString<int>(&local_a8,(int *)&local_128);
    std::operator+(&local_88,&local_108,&local_a8);
    std::operator+(&local_40,&local_88,": ");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pipe_fd,
                   &local_40,"pipe(pipe_fd) != -1");
    DeathTestAbort((string *)pipe_fd);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)pipe_fd,"",(allocator<char> *)&local_40);
    DeathTest::set_last_death_test_message((string *)pipe_fd);
    std::__cxx11::string::~string((string *)pipe_fd);
    CaptureStderr();
    FlushInfoLog();
    _Var2 = fork();
    if (_Var2 != -1) {
      *(__pid_t *)&(this->super_ForkingDeathTest).super_DeathTestImpl.field_0x3c = _Var2;
      if (_Var2 == 0) {
        TVar8 = EXECUTE_TEST;
        do {
          iVar1 = close(local_68);
          if (iVar1 != -1) goto LAB_0014622b;
          piVar4 = __errno_location();
        } while (*piVar4 == 4);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_a8,"CHECK failed: File ",&local_19);
        std::operator+(&local_c8,&local_a8,
                       "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/extern/googletest/googletest/src/gtest-death-test.cc"
                      );
        std::operator+(&local_e8,&local_c8,", line ");
        local_20 = 0x479;
        StreamableToString<int>(&local_128,&local_20);
        std::operator+(&local_108,&local_e8,&local_128);
        std::operator+(&local_88,&local_108,": ");
        std::operator+(&local_40,&local_88,"close(pipe_fd[0])");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pipe_fd,
                       &local_40," != -1");
        DeathTestAbort((string *)pipe_fd);
LAB_0014622b:
        (this->super_ForkingDeathTest).super_DeathTestImpl.write_fd_ = local_64;
        pUVar5 = GetUnitTestImpl();
        ((pUVar5->listeners_).repeater_)->forwarding_enabled_ = false;
        g_in_fast_death_test_child = 1;
      }
      else {
        do {
          iVar1 = close(local_64);
          if (iVar1 != -1) goto LAB_00146137;
          piVar4 = __errno_location();
        } while (*piVar4 == 4);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_a8,"CHECK failed: File ",&local_19);
        std::operator+(&local_c8,&local_a8,
                       "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/extern/googletest/googletest/src/gtest-death-test.cc"
                      );
        std::operator+(&local_e8,&local_c8,", line ");
        local_20 = 0x485;
        StreamableToString<int>(&local_128,&local_20);
        std::operator+(&local_108,&local_e8,&local_128);
        std::operator+(&local_88,&local_108,": ");
        std::operator+(&local_40,&local_88,"close(pipe_fd[1])");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pipe_fd,
                       &local_40," != -1");
        DeathTestAbort((string *)pipe_fd);
LAB_00146137:
        (this->super_ForkingDeathTest).super_DeathTestImpl.read_fd_ = local_68;
        (this->super_ForkingDeathTest).super_DeathTestImpl.spawned_ = true;
        TVar8 = OVERSEE_TEST;
      }
      return TVar8;
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,"CHECK failed: File ",(allocator<char> *)&local_20);
  std::operator+(&local_e8,&local_c8,
                 "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/extern/googletest/googletest/src/gtest-death-test.cc"
                );
  std::operator+(&local_108,&local_e8,", line ");
  local_128._M_dataplus._M_p._0_4_ = 0x476;
  StreamableToString<int>(&local_a8,(int *)&local_128);
  std::operator+(&local_88,&local_108,&local_a8);
  std::operator+(&local_40,&local_88,": ");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pipe_fd,
                 &local_40,"child_pid != -1");
  DeathTestAbort((string *)pipe_fd);
  std::__cxx11::string::~string((string *)pipe_fd);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_c8);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

DeathTest::TestRole NoExecDeathTest::AssumeRole() {
  const size_t thread_count = GetThreadCount();
  if (thread_count != 1) {
    GTEST_LOG_(WARNING) << DeathTestThreadWarning(thread_count);
  }

  int pipe_fd[2];
  GTEST_DEATH_TEST_CHECK_(pipe(pipe_fd) != -1);

  DeathTest::set_last_death_test_message("");
  CaptureStderr();
  // When we fork the process below, the log file buffers are copied, but the
  // file descriptors are shared.  We flush all log files here so that closing
  // the file descriptors in the child process doesn't throw off the
  // synchronization between descriptors and buffers in the parent process.
  // This is as close to the fork as possible to avoid a race condition in case
  // there are multiple threads running before the death test, and another
  // thread writes to the log file.
  FlushInfoLog();

  const pid_t child_pid = fork();
  GTEST_DEATH_TEST_CHECK_(child_pid != -1);
  set_child_pid(child_pid);
  if (child_pid == 0) {
    GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[0]));
    set_write_fd(pipe_fd[1]);
    // Redirects all logging to stderr in the child process to prevent
    // concurrent writes to the log files.  We capture stderr in the parent
    // process and append the child process' output to a log.
    LogToStderr();
    // Event forwarding to the listeners of event listener API mush be shut
    // down in death test subprocesses.
    GetUnitTestImpl()->listeners()->SuppressEventForwarding();
    g_in_fast_death_test_child = true;
    return EXECUTE_TEST;
  } else {
    GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[1]));
    set_read_fd(pipe_fd[0]);
    set_spawned(true);
    return OVERSEE_TEST;
  }
}